

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Acec_Box_t * Acec_ProduceBox(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  void *__ptr;
  int iVar2;
  int iVar3;
  Vec_Int_t *vAdds;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vRanks;
  Vec_Int_t *vXorRoots;
  Vec_Wec_t *vXorLeaves;
  Acec_Box_t *pBox;
  int iVar5;
  long lVar6;
  long lVar7;
  Gia_Man_t *p_00;
  Vec_Int_t *vXors;
  Vec_Wec_t *vAddBoxes;
  timespec ts;
  Vec_Int_t *local_58;
  Vec_Wec_t *local_50;
  uint local_48;
  int local_44;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vAdds = Ree_ManComputeCuts(p,&local_58,0);
  pVVar4 = Acec_FindXorRoots(p,local_58);
  vRanks = Acec_RankTrees(p,local_58,pVVar4);
  local_50 = (Vec_Wec_t *)0x0;
  p_00 = p;
  Gia_ManLevelNum(p);
  if (fVerbose != 0) {
    local_44 = fVerbose;
    local_48 = Ree_ManCountFadds(vAdds);
    iVar2 = vAdds->nSize;
    iVar3 = Ree_ManCountFadds(vAdds);
    iVar1 = local_58->nSize;
    iVar5 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar5 = iVar1;
    }
    printf("Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ",(ulong)local_48,
           (ulong)(uint)(iVar2 / 6 - iVar3),(ulong)(uint)(iVar5 >> 2));
    p_00 = (Gia_Man_t *)0x3;
    iVar2 = clock_gettime(3,&local_40);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print((int)p_00,"%s =","Time");
    Abc_Print((int)p_00,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
    fVerbose = local_44;
  }
  vXorRoots = Acec_OrderTreeRoots(p_00,vAdds,pVVar4,vRanks);
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  if (vRanks->pArray != (int *)0x0) {
    free(vRanks->pArray);
  }
  free(vRanks);
  pVVar4 = Acec_RankTrees(p,local_58,vXorRoots);
  vXorLeaves = Acec_FindXorLeaves(p,local_58,vAdds,vXorRoots,pVVar4,&local_50);
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  Acec_TreeVerifyConnections(p,vAdds,local_50);
  pBox = Acec_FindBox(p,vAdds,local_50,vXorLeaves,vXorRoots);
  if (fVerbose != 0) {
    Acec_TreePrintBox(pBox,vAdds);
  }
  if (vXorRoots->pArray != (int *)0x0) {
    free(vXorRoots->pArray);
  }
  free(vXorRoots);
  iVar2 = vXorLeaves->nCap;
  pVVar4 = vXorLeaves->pArray;
  if ((long)iVar2 < 1) {
    if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_0068933c;
  }
  else {
    lVar6 = 0;
    do {
      __ptr = *(void **)((long)&pVVar4->pArray + lVar6);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar4->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar6);
  }
  free(pVVar4);
LAB_0068933c:
  free(vXorLeaves);
  if (local_58->pArray != (int *)0x0) {
    free(local_58->pArray);
  }
  free(local_58);
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
  }
  free(vAdds);
  return pBox;
}

Assistant:

Acec_Box_t * Acec_ProduceBox( Gia_Man_t * p, int fVerbose )
{
    extern void Acec_TreeVerifyConnections( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );

    abctime clk = Abc_Clock();
    Acec_Box_t * pBox = NULL;
    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, 0 );
    Vec_Int_t * vTemp, * vXorRoots = Acec_FindXorRoots( p, vXors ); 
    Vec_Int_t * vRanks = Acec_RankTrees( p, vXors, vXorRoots ); 
    Vec_Wec_t * vXorLeaves, * vAddBoxes = NULL; 

    Gia_ManLevelNum(p);

    //Acec_CheckXors( p, vXors );

    //Ree_ManPrintAdders( vAdds, 1 );
    if ( fVerbose )
        printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    vXorRoots = Acec_OrderTreeRoots( p, vAdds, vTemp = vXorRoots, vRanks );
    Vec_IntFree( vTemp );
    Vec_IntFree( vRanks );

    vRanks = Acec_RankTrees( p, vXors, vXorRoots ); 
    vXorLeaves = Acec_FindXorLeaves( p, vXors, vAdds, vXorRoots, vRanks, &vAddBoxes ); 
    Vec_IntFree( vRanks );

    //printf( "XOR roots after reordering: \n" );
    //Vec_IntPrint( vXorRoots );
    //printf( "XOR leaves: \n" );
    //Vec_WecPrint( vXorLeaves, 0 );
    //printf( "Adder boxes: \n" );
    //Vec_WecPrint( vAddBoxes, 0 );

    Acec_TreeVerifyConnections( p, vAdds, vAddBoxes );

    pBox = Acec_FindBox( p, vAdds, vAddBoxes, vXorLeaves, vXorRoots );
    //Vec_WecFree( vAddBoxes );

    if ( fVerbose )
        Acec_TreePrintBox( pBox, vAdds );

    Vec_IntFree( vXorRoots );
    Vec_WecFree( vXorLeaves );

    Vec_IntFree( vXors );
    Vec_IntFree( vAdds );

    return pBox;
}